

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_header(CompilerGLSL *this)

{
  Bitset *this_00;
  long lVar1;
  Precision PVar2;
  _Alloc_hider *p_Var3;
  bool bVar4;
  uint uVar5;
  SPIREntryPoint *pSVar6;
  char *pcVar7;
  uint64_t uVar8;
  CompilerError *this_01;
  uint *ts_1;
  undefined8 extraout_RDX;
  undefined8 uVar9;
  undefined8 extraout_RDX_00;
  ShaderSubgroupSupportHelper *this_02;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  SpecializationConstant wg_z;
  char *local_270;
  char *local_268;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  outputs;
  
  pSVar6 = Compiler::get_entry_point(&this->super_Compiler);
  pcVar7 = " es";
  if ((this->options).version < 0x65) {
    pcVar7 = "";
  }
  if ((this->options).es == false) {
    pcVar7 = "";
  }
  inputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7;
  statement<char_const(&)[10],unsigned_int&,char_const*>
            (this,(char (*) [10])"#version ",&(this->options).version,(char **)&inputs);
  if (((this->options).es == false) && ((this->options).version < 0x1a4)) {
    if ((this->options).enable_420pack_extension == true) {
      statement<char_const(&)[39]>(this,(char (*) [39])"#ifdef GL_ARB_shading_language_420pack");
      statement<char_const(&)[53]>
                (this,(char (*) [53])"#extension GL_ARB_shading_language_420pack : require");
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    if (((pSVar6->flags).lower & 0x200) != 0) {
      ::std::__cxx11::string::string
                ((string *)&inputs,"GL_ARB_shader_image_load_store",(allocator *)&outputs);
      require_extension_internal(this,(string *)&inputs);
      ::std::__cxx11::string::~string((string *)&inputs);
    }
  }
  this_00 = &pSVar6->flags;
  bVar4 = Bitset::get(this_00,0x115e);
  if (bVar4) {
    ::std::__cxx11::string::string
              ((string *)&inputs,"GL_ARB_post_depth_coverage",(allocator *)&outputs);
    require_extension_internal(this,(string *)&inputs);
    ::std::__cxx11::string::~string((string *)&inputs);
  }
  bVar4 = Bitset::get(this_00,0x14f6);
  if ((((bVar4) || (bVar4 = Bitset::get(this_00,0x14f7), bVar4)) ||
      (bVar4 = Bitset::get(this_00,0x14f8), bVar4)) || (bVar4 = Bitset::get(this_00,0x14f9), bVar4))
  {
    uVar5 = (this->options).version;
    if ((this->options).es == true) {
      if (uVar5 < 0x136) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&inputs,"At least ESSL 3.10 required for fragment shader interlock.",
                   (allocator *)&outputs);
        CompilerError::CompilerError(this_01,(string *)&inputs);
        __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::string
                ((string *)&inputs,"GL_NV_fragment_shader_interlock",(allocator *)&outputs);
      require_extension_internal(this,(string *)&inputs);
    }
    else {
      if (uVar5 < 0x1a4) {
        ::std::__cxx11::string::string
                  ((string *)&inputs,"GL_ARB_shader_image_load_store",(allocator *)&outputs);
        require_extension_internal(this,(string *)&inputs);
        ::std::__cxx11::string::~string((string *)&inputs);
      }
      ::std::__cxx11::string::string
                ((string *)&inputs,"GL_ARB_fragment_shader_interlock",(allocator *)&outputs);
      require_extension_internal(this,(string *)&inputs);
    }
    ::std::__cxx11::string::~string((string *)&inputs);
  }
  pbVar11 = (this->forced_extensions).
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr;
  for (lVar10 = (this->forced_extensions).
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .buffer_size << 5; lVar10 != 0; lVar10 = lVar10 + -0x20) {
    bVar4 = ::std::operator==(pbVar11,"GL_EXT_shader_explicit_arithmetic_types_float16");
    if (bVar4) {
      statement<char_const(&)[42]>(this,(char (*) [42])"#if defined(GL_AMD_gpu_shader_half_float)");
      statement<char_const(&)[50]>
                (this,(char (*) [50])"#extension GL_AMD_gpu_shader_half_float : require");
      if ((this->options).vulkan_semantics == false) {
        statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
        statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require");
      }
      else {
        statement<char_const(&)[63]>
                  (this,(char (*) [63])
                        "#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
        statement<char_const(&)[69]>
                  (this,(char (*) [69])
                        "#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
      }
      statement<char_const(&)[6]>(this,(char (*) [6])"#else");
      statement<char_const(&)[40]>(this,(char (*) [40])"#error No extension available for FP16.");
LAB_002061f5:
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    else {
      bVar4 = ::std::operator==(pbVar11,"GL_EXT_shader_explicit_arithmetic_types_int16");
      if (bVar4) {
        if ((this->options).vulkan_semantics == true) {
          statement<char_const(&)[67]>
                    (this,(char (*) [67])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
          goto LAB_00206200;
        }
        statement<char_const(&)[37]>(this,(char (*) [37])"#if defined(GL_AMD_gpu_shader_int16)");
        statement<char_const(&)[45]>
                  (this,(char (*) [45])"#extension GL_AMD_gpu_shader_int16 : require");
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        statement<char_const(&)[41]>(this,(char (*) [41])"#error No extension available for Int16.")
        ;
        goto LAB_002061f5;
      }
      bVar4 = ::std::operator==(pbVar11,"GL_ARB_post_depth_coverage");
      if (bVar4) {
        if ((this->options).es != true) {
          statement<char_const(&)[39]>(this,(char (*) [39])"#if defined(GL_ARB_post_depth_coverge)")
          ;
          statement<char_const(&)[48]>
                    (this,(char (*) [48])"#extension GL_ARB_post_depth_coverage : require");
          statement<char_const(&)[6]>(this,(char (*) [6])"#else");
          statement<char_const(&)[48]>
                    (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
          goto LAB_002061f5;
        }
        statement<char_const(&)[48]>
                  (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
      }
      else {
        if (((this->options).vulkan_semantics == false) &&
           (bVar4 = ::std::operator==(pbVar11,"GL_ARB_shader_draw_parameters"), bVar4)) {
          statement<char_const(&)[8],std::__cxx11::string&>(this,(char (*) [8])"#ifdef ",pbVar11);
          statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[10]>
                    (this,(char (*) [12])"#extension ",pbVar11,(char (*) [10])" : enable");
          goto LAB_002061f5;
        }
        statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[11]>
                  (this,(char (*) [12])"#extension ",pbVar11,(char (*) [11])0x304e09);
      }
    }
LAB_00206200:
    pbVar11 = pbVar11 + 1;
  }
  if ((this->options).vulkan_semantics == false) {
    ShaderSubgroupSupportHelper::resolve((Result *)&wg_x,&this->shader_subgroup_supporter);
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      if (((this->shader_subgroup_supporter).feature_mask >>
           ((Feature)lVar10 & (FeatureCount|SubgroupBallotBitCount)) & 1) != 0) {
        ShaderSubgroupSupportHelper::get_candidates_for_feature
                  ((CandidateVector *)&outputs,(Feature)lVar10,(Result *)&wg_x);
        if (outputs.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .buffer_size != 0) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x303078);
          lVar1 = outputs.
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .buffer_size * 4;
          p_Var3 = &(outputs.
                     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr)->_M_dataplus;
          uVar9 = extraout_RDX;
          for (pbVar11 = outputs.
                         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .ptr;
              pbVar11 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&p_Var3->_M_p + lVar1);
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar11->_M_dataplus)._M_p + 4)) {
            this_02 = (ShaderSubgroupSupportHelper *)(ulong)*(uint *)&(pbVar11->_M_dataplus)._M_p;
            pcVar7 = (char *)((long)"==================\n\n" + 0x14);
            if (this_02 == (ShaderSubgroupSupportHelper *)0x8) {
              pcVar7 = "(defined(GL_AMD_gpu_shader_int64) || defined(GL_NV_gpu_shader5))";
            }
            wg_y = *(SpecializationConstant *)
                    (ShaderSubgroupSupportHelper::get_extension_name::retval + (long)this_02);
            if (this_02 == (ShaderSubgroupSupportHelper *)0x6) {
              pcVar7 = "defined(GL_ARB_shader_int64)";
            }
            wg_z = (SpecializationConstant)pcVar7;
            ShaderSubgroupSupportHelper::get_extra_required_extension_names_abi_cxx11_
                      (&inputs,this_02,(Candidate)uVar9);
            local_268 = "#elif";
            if (pbVar11 ==
                outputs.
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .ptr) {
              local_268 = "#if";
            }
            local_270 = " && ";
            if (*(char *)wg_z == '\0') {
              local_270 = "";
            }
            statement<char_const*,char_const(&)[10],char_const*&,char_const(&)[2],char_const*,char_const*&>
                      (this,&local_268,(char (*) [10])" defined(",(char **)&wg_y,
                       (char (*) [2])0x30ae46,&local_270,(char **)&wg_z);
            ts_1_00 = inputs.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr;
            for (lVar12 = inputs.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .buffer_size << 5; lVar12 != 0; lVar12 = lVar12 + -0x20) {
              statement<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[10]>
                        (this,(char (*) [12])"#extension ",ts_1_00,(char (*) [10])" : enable");
              ts_1_00 = ts_1_00 + 1;
            }
            statement<char_const(&)[12],char_const*&,char_const(&)[11]>
                      (this,(char (*) [12])"#extension ",(char **)&wg_y,(char (*) [11])0x304e09);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::~SmallVector(&inputs);
            uVar9 = extraout_RDX_00;
          }
          if (ShaderSubgroupSupportHelper::can_feature_be_implemented_without_extensions::retval
              [lVar10] == false) {
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[70]>
                      (this,(char (*) [70])
                            "#error No extensions available to emulate requested subgroup feature.")
            ;
          }
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
        }
        SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_9UL>::
        ~SmallVector((SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_9UL>
                      *)&outputs);
      }
    }
  }
  pbVar11 = (this->header_lines).
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr;
  for (lVar10 = (this->header_lines).
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .buffer_size << 5; lVar10 != 0; lVar10 = lVar10 + -0x20) {
    statement<std::__cxx11::string&>(this,pbVar11);
    pbVar11 = pbVar11 + 1;
  }
  inputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inputs.stack_storage;
  inputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  inputs.buffer_capacity = 8;
  outputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputs.stack_storage
  ;
  outputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  outputs.buffer_capacity = 8;
  ts_1 = &switchD_002063b3::switchdataD_00303240;
  switch(pSVar6->model) {
  case ExecutionModelTessellationControl:
    if (((pSVar6->flags).lower & 0x4000000) == 0) goto switchD_002063b3_default;
    join<char_const(&)[12],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)0x3050fe,(char (*) [12])&pSVar6->output_vertices,
               &switchD_002063b3::switchdataD_00303240);
    break;
  case ExecutionModelTessellationEvaluation:
    uVar8 = this_00->lower;
    if (((uint)uVar8 >> 0x18 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"quads",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = this_00->lower;
    }
    if (((uint)uVar8 >> 0x16 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"triangles",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = this_00->lower;
    }
    if (((uint)uVar8 >> 0x19 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"isolines",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = this_00->lower;
    }
    if (((uint)uVar8 >> 10 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"point_mode",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = this_00->lower;
    }
    if (((uint)uVar8 >> 0x19 & 1) == 0) {
      if ((uVar8 & 0x10) != 0) {
        ::std::__cxx11::string::string((string *)&wg_x,"cw",(allocator *)&wg_y);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &wg_x);
        ::std::__cxx11::string::~string((string *)&wg_x);
        uVar8 = this_00->lower;
      }
      if ((uVar8 & 0x20) != 0) {
        ::std::__cxx11::string::string((string *)&wg_x,"ccw",(allocator *)&wg_y);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &wg_x);
        ::std::__cxx11::string::~string((string *)&wg_x);
        uVar8 = this_00->lower;
      }
    }
    if ((uVar8 & 4) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"fractional_even_spacing",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = this_00->lower;
    }
    if ((uVar8 & 8) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"fractional_odd_spacing",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = this_00->lower;
    }
    if ((uVar8 & 2) == 0) goto switchD_002063b3_default;
    ::std::__cxx11::string::string((string *)&wg_x,"equal_spacing",(allocator *)&wg_y);
    goto LAB_00206b5a;
  case ExecutionModelGeometry:
    uVar5 = (uint)this_00->lower;
    if (((this_00->lower & 1) != 0) && (pSVar6->invocations != 1)) {
      join<char_const(&)[15],unsigned_int&>
                ((string *)&wg_x,(spirv_cross *)"invocations = ",(char (*) [15])&pSVar6->invocations
                 ,&switchD_002063b3::switchdataD_00303240);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar5 = (uint)this_00->lower;
    }
    if ((uVar5 >> 0x13 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"points",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar5 = (uint)this_00->lower;
    }
    if ((uVar5 >> 0x14 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"lines",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar5 = (uint)this_00->lower;
    }
    if ((uVar5 >> 0x15 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"lines_adjacency",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar5 = (uint)this_00->lower;
    }
    if ((uVar5 >> 0x16 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"triangles",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar5 = (uint)this_00->lower;
    }
    if ((uVar5 >> 0x17 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"triangles_adjacency",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
    }
    if (pSVar6->geometry_passthrough != false) goto switchD_002063b3_default;
    join<char_const(&)[16],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)"max_vertices = ",
               (char (*) [16])&pSVar6->output_vertices,ts_1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&outputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x)
    ;
    ::std::__cxx11::string::~string((string *)&wg_x);
    uVar5 = (uint)this_00->lower;
    if ((uVar5 >> 0x1d & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"triangle_strip",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&outputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &wg_x);
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar5 = (uint)this_00->lower;
    }
    if ((uVar5 >> 0x1b & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"points",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&outputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &wg_x);
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar5 = (uint)this_00->lower;
    }
    if ((uVar5 >> 0x1c & 1) == 0) goto switchD_002063b3_default;
    ::std::__cxx11::string::string((string *)&wg_x,"line_strip",(allocator *)&wg_y);
    break;
  case ExecutionModelFragment:
    if ((this->options).es == true) {
      PVar2 = (this->options).fragment.default_float_precision;
      if (PVar2 == Highp) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision highp float;");
      }
      else if (PVar2 == Mediump) {
        statement<char_const(&)[25]>(this,(char (*) [25])"precision mediump float;");
      }
      else if (PVar2 == Lowp) {
        statement<char_const(&)[22]>(this,(char (*) [22])"precision lowp float;");
      }
      PVar2 = (this->options).fragment.default_int_precision;
      if (PVar2 == Highp) {
        statement<char_const(&)[21]>(this,(char (*) [21])"precision highp int;");
      }
      else if (PVar2 == Mediump) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision mediump int;");
      }
      else if (PVar2 == Lowp) {
        statement<char_const(&)[20]>(this,(char (*) [20])"precision lowp int;");
      }
    }
    if (((pSVar6->flags).lower & 0x200) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"early_fragment_tests",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
    }
    bVar4 = Bitset::get(this_00,0x115e);
    if (bVar4) {
      ::std::__cxx11::string::string((string *)&wg_x,"post_depth_coverage",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
    }
    bVar4 = Bitset::get(this_00,0x14f6);
    if (bVar4) {
      ::std::__cxx11::string::string((string *)&wg_x,"pixel_interlock_ordered",(allocator *)&wg_y);
LAB_00206cf9:
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
    }
    else {
      bVar4 = Bitset::get(this_00,0x14f7);
      if (bVar4) {
        ::std::__cxx11::string::string
                  ((string *)&wg_x,"pixel_interlock_unordered",(allocator *)&wg_y);
        goto LAB_00206cf9;
      }
      bVar4 = Bitset::get(this_00,0x14f8);
      if (bVar4) {
        ::std::__cxx11::string::string
                  ((string *)&wg_x,"sample_interlock_ordered",(allocator *)&wg_y);
        goto LAB_00206cf9;
      }
      bVar4 = Bitset::get(this_00,0x14f9);
      if (bVar4) {
        ::std::__cxx11::string::string
                  ((string *)&wg_x,"sample_interlock_unordered",(allocator *)&wg_y);
        goto LAB_00206cf9;
      }
    }
    if ((this->options).es == false) {
      if (((uint)this_00->lower >> 0xe & 1) == 0) {
        if ((short)this_00->lower < 0) {
          statement<char_const(&)[43]>
                    (this,(char (*) [43])"layout(depth_less) out float gl_FragDepth;");
        }
      }
      else {
        statement<char_const(&)[46]>
                  (this,(char (*) [46])"layout(depth_greater) out float gl_FragDepth;");
      }
    }
    goto switchD_002063b3_default;
  case ExecutionModelGLCompute:
    if ((pSVar6->workgroup_size).constant != 0) {
      wg_x.id.id = 0;
      wg_y = (SpecializationConstant)((ulong)wg_y & 0xffffffff00000000);
      wg_z = (SpecializationConstant)((ulong)wg_z & 0xffffffff00000000);
      Compiler::get_work_group_size_specialization_constants
                (&this->super_Compiler,&wg_x,&wg_y,&wg_z);
      if (((this->options).vulkan_semantics != false) ||
         (((wg_x.id.id == 0 && (wg_y.id.id == 0)) && (wg_z.id.id == 0)))) {
        build_workgroup_size(this,&inputs,&wg_x,&wg_y,&wg_z);
      }
      goto switchD_002063b3_default;
    }
    join<char_const(&)[16],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)"local_size_x = ",
               (char (*) [16])&pSVar6->workgroup_size,&switchD_002063b3::switchdataD_00303240);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x);
    ::std::__cxx11::string::~string((string *)&wg_x);
    join<char_const(&)[16],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)"local_size_y = ",
               (char (*) [16])&(pSVar6->workgroup_size).y,ts_1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x);
    ::std::__cxx11::string::~string((string *)&wg_x);
    join<char_const(&)[16],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)"local_size_z = ",
               (char (*) [16])&(pSVar6->workgroup_size).z,ts_1);
LAB_00206b5a:
    this_03 = &inputs;
    goto LAB_00206b5f;
  default:
    goto switchD_002063b3_default;
  }
  this_03 = &outputs;
LAB_00206b5f:
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(this_03,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x);
  ::std::__cxx11::string::~string((string *)&wg_x);
switchD_002063b3_default:
  if (inputs.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size != 0) {
    merge((string *)&wg_x,&inputs,", ");
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x,
               (char (*) [6])") in;");
    ::std::__cxx11::string::~string((string *)&wg_x);
  }
  if (outputs.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size != 0) {
    merge((string *)&wg_x,&outputs,", ");
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[7]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x,
               (char (*) [7])") out;");
    ::std::__cxx11::string::~string((string *)&wg_x);
  }
  statement<char_const(&)[1]>(this,(char (*) [1])0x303078);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&outputs);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&inputs);
  return;
}

Assistant:

void CompilerGLSL::emit_header()
{
	auto &execution = get_entry_point();
	statement("#version ", options.version, options.es && options.version > 100 ? " es" : "");

	if (!options.es && options.version < 420)
	{
		// Needed for binding = # on UBOs, etc.
		if (options.enable_420pack_extension)
		{
			statement("#ifdef GL_ARB_shading_language_420pack");
			statement("#extension GL_ARB_shading_language_420pack : require");
			statement("#endif");
		}
		// Needed for: layout(early_fragment_tests) in;
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			require_extension_internal("GL_ARB_shader_image_load_store");
	}

	// Needed for: layout(post_depth_coverage) in;
	if (execution.flags.get(ExecutionModePostDepthCoverage))
		require_extension_internal("GL_ARB_post_depth_coverage");

	// Needed for: layout({pixel,sample}_interlock_[un]ordered) in;
	if (execution.flags.get(ExecutionModePixelInterlockOrderedEXT) ||
	    execution.flags.get(ExecutionModePixelInterlockUnorderedEXT) ||
	    execution.flags.get(ExecutionModeSampleInterlockOrderedEXT) ||
	    execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT))
	{
		if (options.es)
		{
			if (options.version < 310)
				SPIRV_CROSS_THROW("At least ESSL 3.10 required for fragment shader interlock.");
			require_extension_internal("GL_NV_fragment_shader_interlock");
		}
		else
		{
			if (options.version < 420)
				require_extension_internal("GL_ARB_shader_image_load_store");
			require_extension_internal("GL_ARB_fragment_shader_interlock");
		}
	}

	for (auto &ext : forced_extensions)
	{
		if (ext == "GL_EXT_shader_explicit_arithmetic_types_float16")
		{
			// Special case, this extension has a potential fallback to another vendor extension in normal GLSL.
			// GL_AMD_gpu_shader_half_float is a superset, so try that first.
			statement("#if defined(GL_AMD_gpu_shader_half_float)");
			statement("#extension GL_AMD_gpu_shader_half_float : require");
			if (!options.vulkan_semantics)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			else
			{
				statement("#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
			}
			statement("#else");
			statement("#error No extension available for FP16.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int16")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
			else
			{
				statement("#if defined(GL_AMD_gpu_shader_int16)");
				statement("#extension GL_AMD_gpu_shader_int16 : require");
				statement("#else");
				statement("#error No extension available for Int16.");
				statement("#endif");
			}
		}
		else if (ext == "GL_ARB_post_depth_coverage")
		{
			if (options.es)
				statement("#extension GL_EXT_post_depth_coverage : require");
			else
			{
				statement("#if defined(GL_ARB_post_depth_coverge)");
				statement("#extension GL_ARB_post_depth_coverage : require");
				statement("#else");
				statement("#extension GL_EXT_post_depth_coverage : require");
				statement("#endif");
			}
		}
		else if (!options.vulkan_semantics && ext == "GL_ARB_shader_draw_parameters")
		{
			// Soft-enable this extension on plain GLSL.
			statement("#ifdef ", ext);
			statement("#extension ", ext, " : enable");
			statement("#endif");
		}
		else
			statement("#extension ", ext, " : require");
	}

	if (!options.vulkan_semantics)
	{
		using Supp = ShaderSubgroupSupportHelper;
		auto result = shader_subgroup_supporter.resolve();

		for (uint32_t feature_index = 0; feature_index < Supp::FeatureCount; feature_index++)
		{
			auto feature = static_cast<Supp::Feature>(feature_index);
			if (!shader_subgroup_supporter.is_feature_requested(feature))
				continue;

			auto exts = Supp::get_candidates_for_feature(feature, result);
			if (exts.empty())
				continue;

			statement("");

			for (auto &ext : exts)
			{
				const char *name = Supp::get_extension_name(ext);
				const char *extra_predicate = Supp::get_extra_required_extension_predicate(ext);
				auto extra_names = Supp::get_extra_required_extension_names(ext);
				statement(&ext != &exts.front() ? "#elif" : "#if", " defined(", name, ")",
				          (*extra_predicate != '\0' ? " && " : ""), extra_predicate);
				for (const auto &e : extra_names)
					statement("#extension ", e, " : enable");
				statement("#extension ", name, " : require");
			}

			if (!Supp::can_feature_be_implemented_without_extensions(feature))
			{
				statement("#else");
				statement("#error No extensions available to emulate requested subgroup feature.");
			}

			statement("#endif");
		}
	}

	for (auto &header : header_lines)
		statement(header);

	SmallVector<string> inputs;
	SmallVector<string> outputs;

	switch (execution.model)
	{
	case ExecutionModelGeometry:
		if ((execution.flags.get(ExecutionModeInvocations)) && execution.invocations != 1)
			inputs.push_back(join("invocations = ", execution.invocations));
		if (execution.flags.get(ExecutionModeInputPoints))
			inputs.push_back("points");
		if (execution.flags.get(ExecutionModeInputLines))
			inputs.push_back("lines");
		if (execution.flags.get(ExecutionModeInputLinesAdjacency))
			inputs.push_back("lines_adjacency");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeInputTrianglesAdjacency))
			inputs.push_back("triangles_adjacency");

		if (!execution.geometry_passthrough)
		{
			// For passthrough, these are implies and cannot be declared in shader.
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			if (execution.flags.get(ExecutionModeOutputTriangleStrip))
				outputs.push_back("triangle_strip");
			if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
			if (execution.flags.get(ExecutionModeOutputLineStrip))
				outputs.push_back("line_strip");
		}
		break;

	case ExecutionModelTessellationControl:
		if (execution.flags.get(ExecutionModeOutputVertices))
			outputs.push_back(join("vertices = ", execution.output_vertices));
		break;

	case ExecutionModelTessellationEvaluation:
		if (execution.flags.get(ExecutionModeQuads))
			inputs.push_back("quads");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeIsolines))
			inputs.push_back("isolines");
		if (execution.flags.get(ExecutionModePointMode))
			inputs.push_back("point_mode");

		if (!execution.flags.get(ExecutionModeIsolines))
		{
			if (execution.flags.get(ExecutionModeVertexOrderCw))
				inputs.push_back("cw");
			if (execution.flags.get(ExecutionModeVertexOrderCcw))
				inputs.push_back("ccw");
		}

		if (execution.flags.get(ExecutionModeSpacingFractionalEven))
			inputs.push_back("fractional_even_spacing");
		if (execution.flags.get(ExecutionModeSpacingFractionalOdd))
			inputs.push_back("fractional_odd_spacing");
		if (execution.flags.get(ExecutionModeSpacingEqual))
			inputs.push_back("equal_spacing");
		break;

	case ExecutionModelGLCompute:
	{
		if (execution.workgroup_size.constant != 0)
		{
			SpecializationConstant wg_x, wg_y, wg_z;
			get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

			// If there are any spec constants on legacy GLSL, defer declaration, we need to set up macro
			// declarations before we can emit the work group size.
			if (options.vulkan_semantics ||
			    ((wg_x.id == ConstantID(0)) && (wg_y.id == ConstantID(0)) && (wg_z.id == ConstantID(0))))
				build_workgroup_size(inputs, wg_x, wg_y, wg_z);
		}
		else
		{
			inputs.push_back(join("local_size_x = ", execution.workgroup_size.x));
			inputs.push_back(join("local_size_y = ", execution.workgroup_size.y));
			inputs.push_back(join("local_size_z = ", execution.workgroup_size.z));
		}
		break;
	}

	case ExecutionModelFragment:
		if (options.es)
		{
			switch (options.fragment.default_float_precision)
			{
			case Options::Lowp:
				statement("precision lowp float;");
				break;

			case Options::Mediump:
				statement("precision mediump float;");
				break;

			case Options::Highp:
				statement("precision highp float;");
				break;

			default:
				break;
			}

			switch (options.fragment.default_int_precision)
			{
			case Options::Lowp:
				statement("precision lowp int;");
				break;

			case Options::Mediump:
				statement("precision mediump int;");
				break;

			case Options::Highp:
				statement("precision highp int;");
				break;

			default:
				break;
			}
		}

		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			inputs.push_back("early_fragment_tests");
		if (execution.flags.get(ExecutionModePostDepthCoverage))
			inputs.push_back("post_depth_coverage");

		if (execution.flags.get(ExecutionModePixelInterlockOrderedEXT))
			inputs.push_back("pixel_interlock_ordered");
		else if (execution.flags.get(ExecutionModePixelInterlockUnorderedEXT))
			inputs.push_back("pixel_interlock_unordered");
		else if (execution.flags.get(ExecutionModeSampleInterlockOrderedEXT))
			inputs.push_back("sample_interlock_ordered");
		else if (execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT))
			inputs.push_back("sample_interlock_unordered");

		if (!options.es && execution.flags.get(ExecutionModeDepthGreater))
			statement("layout(depth_greater) out float gl_FragDepth;");
		else if (!options.es && execution.flags.get(ExecutionModeDepthLess))
			statement("layout(depth_less) out float gl_FragDepth;");

		break;

	default:
		break;
	}

	if (!inputs.empty())
		statement("layout(", merge(inputs), ") in;");
	if (!outputs.empty())
		statement("layout(", merge(outputs), ") out;");

	statement("");
}